

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O3

bool __thiscall HDD::SafetyCheck(HDD *this)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = util::is_stdout_a_tty();
  if (bVar1) {
    util::operator<<((LogHelper *)&util::cout,(char (*) [21])"Are you sure? (y/N) ");
    uVar2 = getchar();
    bVar1 = (uVar2 & 0xffffffdf) == 0x59;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HDD::SafetyCheck()
{
    if (!util::is_stdout_a_tty())
        return false;

    util::cout << "Are you sure? (y/N) ";

    auto ch = getchar();
    return (ch == 'Y' || ch == 'y');
}